

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_ushl_i32_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src,TCGv_i32 shift)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGv_i32 v2;
  TCGv_i32 c2;
  uintptr_t o;
  uintptr_t o_2;
  
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ts_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ts_01 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ts_02 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  v2 = tcg_const_i32_aarch64(tcg_ctx,0);
  c2 = tcg_const_i32_aarch64(tcg_ctx,0x20);
  tcg_gen_ext8s_i32_aarch64(tcg_ctx,(TCGv_i32)((long)ts_01 - (long)tcg_ctx),shift);
  tcg_gen_op2_aarch64(tcg_ctx,INDEX_op_neg_i32,(TCGArg)ts_02,(TCGArg)ts_01);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_shl_i32,(TCGArg)ts,(TCGArg)(src + (long)tcg_ctx),
                      (TCGArg)ts_01);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_shr_i32,(TCGArg)ts_00,(TCGArg)(src + (long)tcg_ctx),
                      (TCGArg)ts_02);
  tcg_gen_movcond_i32_aarch64
            (tcg_ctx,TCG_COND_LTU,dst,(TCGv_i32)((long)ts_01 - (long)tcg_ctx),c2,
             (TCGv_i32)((long)ts - (long)tcg_ctx),v2);
  tcg_gen_movcond_i32_aarch64
            (tcg_ctx,TCG_COND_LTU,dst,(TCGv_i32)((long)ts_02 - (long)tcg_ctx),c2,
             (TCGv_i32)((long)ts_00 - (long)tcg_ctx),dst);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_01);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts_02);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return;
}

Assistant:

void gen_ushl_i32(TCGContext *tcg_ctx, TCGv_i32 dst, TCGv_i32 src, TCGv_i32 shift)
{
    TCGv_i32 lval = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 rval = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 lsh = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 rsh = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 zero = tcg_const_i32(tcg_ctx, 0);
    TCGv_i32 max = tcg_const_i32(tcg_ctx, 32);

    /*
     * Rely on the TCG guarantee that out of range shifts produce
     * unspecified results, not undefined behaviour (i.e. no trap).
     * Discard out-of-range results after the fact.
     */
    tcg_gen_ext8s_i32(tcg_ctx, lsh, shift);
    tcg_gen_neg_i32(tcg_ctx, rsh, lsh);
    tcg_gen_shl_i32(tcg_ctx, lval, src, lsh);
    tcg_gen_shr_i32(tcg_ctx, rval, src, rsh);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, dst, lsh, max, lval, zero);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, dst, rsh, max, rval, dst);

    tcg_temp_free_i32(tcg_ctx, lval);
    tcg_temp_free_i32(tcg_ctx, rval);
    tcg_temp_free_i32(tcg_ctx, lsh);
    tcg_temp_free_i32(tcg_ctx, rsh);
    tcg_temp_free_i32(tcg_ctx, zero);
    tcg_temp_free_i32(tcg_ctx, max);
}